

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O3

bool __thiscall
re2::BitState::Search
          (BitState *this,StringPiece *text,StringPiece *context,bool anchored,bool longest,
          StringPiece *submatch,int nsubmatch)

{
  int iVar1;
  undefined8 *puVar2;
  bool bVar3;
  uint *puVar4;
  char **ppcVar5;
  Job *pJVar6;
  char *p0;
  size_type sVar7;
  bool bVar8;
  uint __c;
  long lVar9;
  Prog *pPVar10;
  uint *__s;
  char **__s_00;
  Job *pJVar11;
  byte *p0_00;
  int iVar12;
  _Tuple_impl<1UL,_re2::PODArray<unsigned_int>::Deleter> _Var13;
  long lVar14;
  byte *pbVar15;
  size_type __n;
  new_allocator<unsigned_int> local_2a;
  new_allocator<const_char_*> local_29;
  
  sVar7 = text->size_;
  (this->text_).data_ = text->data_;
  (this->text_).size_ = sVar7;
  sVar7 = context->size_;
  (this->context_).data_ = context->data_;
  (this->context_).size_ = sVar7;
  if ((this->context_).data_ == (const_pointer)0x0) {
    sVar7 = text->size_;
    (this->context_).data_ = text->data_;
    (this->context_).size_ = sVar7;
  }
  pPVar10 = this->prog_;
  bVar8 = pPVar10->anchor_start_;
  if (((bVar8 != true) || ((this->context_).data_ == text->data_)) &&
     ((bVar3 = pPVar10->anchor_end_, bVar3 != true ||
      ((this->context_).data_ + (this->context_).size_ == text->data_ + text->size_)))) {
    if (anchored) {
      bVar8 = true;
    }
    this->anchored_ = bVar8;
    bVar8 = bVar3;
    if (longest) {
      bVar8 = true;
    }
    this->longest_ = bVar8;
    this->endmatch_ = bVar3;
    this->submatch_ = submatch;
    this->nsubmatch_ = nsubmatch;
    if (0 < nsubmatch) {
      lVar9 = 0;
      lVar14 = 0;
      do {
        puVar2 = (undefined8 *)((long)&this->submatch_->data_ + lVar9);
        *puVar2 = 0;
        puVar2[1] = 0;
        lVar14 = lVar14 + 1;
        lVar9 = lVar9 + 0x10;
      } while (lVar14 < this->nsubmatch_);
      pPVar10 = this->prog_;
    }
    iVar12 = ((int)text->size_ + 1) * pPVar10->list_count_;
    iVar1 = iVar12 + 0x1f;
    iVar12 = iVar12 + 0x3e;
    if (-1 < iVar1) {
      iVar12 = iVar1;
    }
    _Var13.super__Head_base<1UL,_re2::PODArray<unsigned_int>::Deleter,_false>._M_head_impl.len_ =
         (_Head_base<1UL,_re2::PODArray<unsigned_int>::Deleter,_false>)(iVar12 >> 5);
    __s = __gnu_cxx::new_allocator<unsigned_int>::allocate
                    (&local_2a,
                     (long)(int)_Var13.
                                super__Head_base<1UL,_re2::PODArray<unsigned_int>::Deleter,_false>.
                                _M_head_impl.len_,(void *)0x0);
    puVar4 = (this->visited_).ptr_._M_t.
             super___uniq_ptr_impl<unsigned_int,_re2::PODArray<unsigned_int>::Deleter>._M_t.
             super__Tuple_impl<0UL,_unsigned_int_*,_re2::PODArray<unsigned_int>::Deleter>.
             super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
    (this->visited_).ptr_._M_t.
    super___uniq_ptr_impl<unsigned_int,_re2::PODArray<unsigned_int>::Deleter>._M_t.
    super__Tuple_impl<0UL,_unsigned_int_*,_re2::PODArray<unsigned_int>::Deleter>.
    super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = __s;
    if (puVar4 != (uint *)0x0) {
      operator_delete(puVar4);
      __s = (this->visited_).ptr_._M_t.
            super___uniq_ptr_impl<unsigned_int,_re2::PODArray<unsigned_int>::Deleter>._M_t.
            super__Tuple_impl<0UL,_unsigned_int_*,_re2::PODArray<unsigned_int>::Deleter>.
            super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
    }
    (this->visited_).ptr_._M_t.
    super___uniq_ptr_impl<unsigned_int,_re2::PODArray<unsigned_int>::Deleter>._M_t.
    super__Tuple_impl<0UL,_unsigned_int_*,_re2::PODArray<unsigned_int>::Deleter>.
    super__Tuple_impl<1UL,_re2::PODArray<unsigned_int>::Deleter>.
    super__Head_base<1UL,_re2::PODArray<unsigned_int>::Deleter,_false> =
         _Var13.super__Head_base<1UL,_re2::PODArray<unsigned_int>::Deleter,_false>._M_head_impl.len_
    ;
    memset(__s,0,(long)(int)_Var13.
                            super__Head_base<1UL,_re2::PODArray<unsigned_int>::Deleter,_false>.
                            _M_head_impl.len_ << 2);
    __n = 2;
    if (2 < nsubmatch * 2) {
      __n = (size_type)(uint)(nsubmatch * 2);
    }
    __s_00 = __gnu_cxx::new_allocator<const_char_*>::allocate(&local_29,__n,(void *)0x0);
    ppcVar5 = (this->cap_).ptr_._M_t.
              super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>._M_t.
              super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>.
              super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
    (this->cap_).ptr_._M_t.super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>
    ._M_t.super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>.
    super__Head_base<0UL,_const_char_**,_false>._M_head_impl = __s_00;
    if (ppcVar5 != (char **)0x0) {
      operator_delete(ppcVar5);
      __s_00 = (this->cap_).ptr_._M_t.
               super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>._M_t.
               super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>.
               super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
    }
    (this->cap_).ptr_._M_t.super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>
    ._M_t.super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>.
    super__Tuple_impl<1UL,_re2::PODArray<const_char_*>::Deleter>.
    super__Head_base<1UL,_re2::PODArray<const_char_*>::Deleter,_false> = (Deleter)SUB84(__n,0);
    memset(__s_00,0,__n * 8);
    pJVar11 = (Job *)operator_new(0x400);
    pJVar6 = (this->job_).ptr_._M_t.
             super___uniq_ptr_impl<re2::Job,_re2::PODArray<re2::Job>::Deleter>._M_t.
             super__Tuple_impl<0UL,_re2::Job_*,_re2::PODArray<re2::Job>::Deleter>.
             super__Head_base<0UL,_re2::Job_*,_false>._M_head_impl;
    (this->job_).ptr_._M_t.super___uniq_ptr_impl<re2::Job,_re2::PODArray<re2::Job>::Deleter>._M_t.
    super__Tuple_impl<0UL,_re2::Job_*,_re2::PODArray<re2::Job>::Deleter>.
    super__Head_base<0UL,_re2::Job_*,_false>._M_head_impl = pJVar11;
    if (pJVar6 != (Job *)0x0) {
      operator_delete(pJVar6);
    }
    (this->job_).ptr_._M_t.super___uniq_ptr_impl<re2::Job,_re2::PODArray<re2::Job>::Deleter>._M_t.
    super__Tuple_impl<0UL,_re2::Job_*,_re2::PODArray<re2::Job>::Deleter>.
    super__Tuple_impl<1UL,_re2::PODArray<re2::Job>::Deleter>.
    super__Head_base<1UL,_re2::PODArray<re2::Job>::Deleter,_false> =
         (_Head_base<1UL,_re2::PODArray<re2::Job>::Deleter,_false>)0x40;
    if (this->anchored_ != false) {
      p0 = text->data_;
      *(this->cap_).ptr_._M_t.
       super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>._M_t.
       super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>.
       super__Head_base<0UL,_const_char_**,_false>._M_head_impl = p0;
      bVar8 = TrySearch(this,this->prog_->start_,p0);
      return bVar8;
    }
    if (-1 < (long)text->size_) {
      p0_00 = (byte *)text->data_;
      while( true ) {
        __c = Prog::first_byte(this->prog_);
        if ((((-1 < (int)__c) && (pbVar15 = (byte *)(text->data_ + text->size_), p0_00 < pbVar15))
            && (__c != *p0_00)) &&
           (p0_00 = (byte *)memchr(p0_00,__c,(long)pbVar15 - (long)p0_00), p0_00 == (byte *)0x0)) {
          p0_00 = pbVar15;
        }
        *(this->cap_).ptr_._M_t.
         super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>._M_t.
         super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>.
         super__Head_base<0UL,_const_char_**,_false>._M_head_impl = (char *)p0_00;
        bVar8 = TrySearch(this,this->prog_->start_,(char *)p0_00);
        if (bVar8) break;
        p0_00 = p0_00 + 1;
        if (text->data_ + text->size_ < p0_00) {
          return bVar8;
        }
      }
      return bVar8;
    }
  }
  return false;
}

Assistant:

bool BitState::Search(const StringPiece& text, const StringPiece& context,
                      bool anchored, bool longest,
                      StringPiece* submatch, int nsubmatch) {
  // Search parameters.
  text_ = text;
  context_ = context;
  if (context_.data() == NULL)
    context_ = text;
  if (prog_->anchor_start() && context_.begin() != text.begin())
    return false;
  if (prog_->anchor_end() && context_.end() != text.end())
    return false;
  anchored_ = anchored || prog_->anchor_start();
  longest_ = longest || prog_->anchor_end();
  endmatch_ = prog_->anchor_end();
  submatch_ = submatch;
  nsubmatch_ = nsubmatch;
  for (int i = 0; i < nsubmatch_; i++)
    submatch_[i] = StringPiece();

  // Allocate scratch space.
  int nvisited = prog_->list_count() * static_cast<int>(text.size()+1);
  nvisited = (nvisited + VisitedBits-1) / VisitedBits;
  visited_ = PODArray<uint32_t>(nvisited);
  memset(visited_.data(), 0, nvisited*sizeof visited_[0]);

  int ncap = 2*nsubmatch;
  if (ncap < 2)
    ncap = 2;
  cap_ = PODArray<const char*>(ncap);
  memset(cap_.data(), 0, ncap*sizeof cap_[0]);

  // When sizeof(Job) == 16, we start with a nice round 1KiB. :)
  job_ = PODArray<Job>(64);

  // Anchored search must start at text.begin().
  if (anchored_) {
    cap_[0] = text.data();
    return TrySearch(prog_->start(), text.data());
  }

  // Unanchored search, starting from each possible text position.
  // Notice that we have to try the empty string at the end of
  // the text, so the loop condition is p <= text.end(), not p < text.end().
  // This looks like it's quadratic in the size of the text,
  // but we are not clearing visited_ between calls to TrySearch,
  // so no work is duplicated and it ends up still being linear.
  for (const char* p = text.data(); p <= text.data() + text.size(); p++) {
    // Try to use memchr to find the first byte quickly.
    int fb = prog_->first_byte();
    if (fb >= 0 && p < text.data() + text.size() && (p[0] & 0xFF) != fb) {
      p = reinterpret_cast<const char*>(
          memchr(p, fb, text.data() + text.size() - p));
      if (p == NULL)
        p = text.data() + text.size();
    }

    cap_[0] = p;
    if (TrySearch(prog_->start(), p))  // Match must be leftmost; done.
      return true;
  }
  return false;
}